

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

OP1aHeader * __thiscall ASDCP::MXF::OP1aHeader::InitFromFile(OP1aHeader *this,IFileReader *Reader)

{
  ulong uVar1;
  bool bVar2;
  Dictionary *pDVar3;
  MDDEntry *pMVar4;
  Dictionary *pDVar5;
  ILogSink *pIVar6;
  long *in_RDX;
  char *fmt;
  ui32_t read_count;
  Result_t result;
  uint local_104;
  UL local_100 [3];
  int local_98;
  
  Partition::InitFromFile((Partition *)&stack0xffffffffffffff68,Reader);
  if (-1 < local_98) {
    pDVar5 = *(Dictionary **)(Reader + 0x78);
    pDVar3 = DefaultCompositeDict();
    if (pDVar5 == pDVar3) {
      pMVar4 = MXFInterop_OPAtom_Entry();
      local_100[0].super_Identifier<16U>.m_HasValue = true;
      local_100[0].super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar4->ul;
      local_100[0].super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar4->ul + 8);
      local_100[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0021d318;
      bVar2 = UL::MatchExact((UL *)(Reader + 200),local_100);
      if (bVar2) {
        pDVar5 = DefaultInteropDict();
      }
      else {
        pMVar4 = SMPTE_390_OPAtom_Entry();
        local_100[0].super_Identifier<16U>.m_HasValue = true;
        local_100[0].super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar4->ul;
        local_100[0].super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar4->ul + 8);
        local_100[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_0021d318;
        bVar2 = UL::MatchExact((UL *)(Reader + 200),local_100);
        if (!bVar2) goto LAB_001a6a33;
        pDVar5 = DefaultSMPTEDict();
      }
      *(Dictionary **)(Reader + 0x78) = pDVar5;
    }
LAB_001a6a33:
    uVar1 = *(ulong *)(Reader + 0xa0);
    if (uVar1 == 0) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar6,"MXF file contents incomplete.\n");
      local_100[0].super_Identifier<16U>.super_IArchive._vptr_IArchive._0_4_ = 0x319;
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_001a6b9b;
    }
    if (uVar1 < 0x400) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      fmt = "Improbably small HeaderByteCount value: %qu\n";
LAB_001a6aa5:
      Kumu::ILogSink::Warn(pIVar6,fmt,*(undefined8 *)(Reader + 0xa0));
    }
    else if (0x400000 < uVar1) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      fmt = "Improbably huge HeaderByteCount value: %qu\n";
      goto LAB_001a6aa5;
    }
    Kumu::ByteString::Capacity((uint)local_100);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)local_100);
    Kumu::Result_t::~Result_t((Result_t *)local_100);
    if (-1 < local_98) {
      if (*(long *)(Reader + 0x130) == 0) {
        __assert_fail("m_Data",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                      ,0x224,"byte_t *Kumu::ByteString::Data()");
      }
      (**(code **)(*in_RDX + 0x38))(local_100);
      Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
      if (local_98 < 0) {
        pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar6,"OP1aHeader::InitFromFile, read failed.\n");
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
        goto LAB_001a6b9b;
      }
      if (local_104 != *(uint *)(Reader + 0x138)) {
        pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar6,"Short read of OP-Atom header metadata; wanted %u, got %u.\n",
                   (ulong)*(uint *)(Reader + 0x138),(ulong)local_104);
        local_100[0].super_Identifier<16U>.super_IArchive._vptr_IArchive._0_4_ = 0x335;
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        goto LAB_001a6b9b;
      }
      if (*(long *)(Reader + 0x130) == 0) {
        __assert_fail("m_Data",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                      ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
      }
      (**(code **)(*(long *)Reader + 0x28))(local_100,Reader);
      Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
LAB_001a6b9b:
  Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromFile(const Kumu::IFileReader& Reader)
{
  Result_t result = Partition::InitFromFile(Reader);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( m_Dict == &DefaultCompositeDict() )
    {
      // select more explicit dictionary if one is available
      if ( OperationalPattern.MatchExact(MXFInterop_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultInteropDict();
	}
      else if ( OperationalPattern.MatchExact(SMPTE_390_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultSMPTEDict();
	}
    }

  // slurp up the remainder of the header
  if ( HeaderByteCount == 0 )
    {
      DefaultLogSink().Warn("MXF file contents incomplete.\n");
      return RESULT_KLV_CODING(__LINE__, __FILE__);
    }
  else if ( HeaderByteCount < 1024 )
    {
      DefaultLogSink().Warn("Improbably small HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  else if (HeaderByteCount > ( 4 * Kumu::Megabyte ) )
    {
      DefaultLogSink().Warn("Improbably huge HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  
  result = m_HeaderData.Capacity(Kumu::xmin(4*Kumu::Megabyte, static_cast<ui32_t>(HeaderByteCount)));

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t read_count;
      result = Reader.Read(m_HeaderData.Data(), m_HeaderData.Capacity(), &read_count);

      if ( ASDCP_FAILURE(result) )
        {
	  DefaultLogSink().Error("OP1aHeader::InitFromFile, read failed.\n");
	  return result;
        }

      if ( read_count != m_HeaderData.Capacity() )
	{
	  DefaultLogSink().Error("Short read of OP-Atom header metadata; wanted %u, got %u.\n",
				 m_HeaderData.Capacity(), read_count);
	  return RESULT_KLV_CODING(__LINE__, __FILE__);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    result = InitFromBuffer(m_HeaderData.RoData(), m_HeaderData.Capacity());

  return result;
}